

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

void av1_cfl_predict_block(MACROBLOCKD *xd,uint8_t *dst,int dst_stride,TX_SIZE tx_size,int plane)

{
  CFL_CTX *pCVar1;
  byte bVar2;
  uint16_t uVar3;
  uint uVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  cfl_subtract_average_fn p_Var21;
  cfl_predict_lbd_fn UNRECOVERED_JUMPTABLE_00;
  cfl_predict_hbd_fn UNRECOVERED_JUMPTABLE;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint16_t *puVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar48;
  int iVar51;
  undefined1 auVar49 [16];
  int iVar52;
  undefined1 auVar50 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  auVar20 = _DAT_004dfbe0;
  auVar19 = _DAT_004dfbd0;
  auVar18 = _DAT_004dfbc0;
  auVar17 = _DAT_004dcdd0;
  pMVar6 = *xd->mi;
  if ((xd->cfl).are_parameters_computed == 0) {
    pCVar1 = &xd->cfl;
    uVar4 = *(uint *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
    iVar24 = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
    iVar28 = (xd->cfl).buf_width;
    iVar5 = (xd->cfl).buf_height;
    iVar26 = iVar24 - iVar5;
    uVar27 = uVar4 - iVar28;
    if (uVar27 != 0 && iVar28 <= (int)uVar4) {
      if (0 < iVar5) {
        puVar25 = pCVar1->recon_buf_q3 + iVar28;
        lVar22 = (ulong)uVar27 - 1;
        auVar29._8_4_ = (int)lVar22;
        auVar29._0_8_ = lVar22;
        auVar29._12_4_ = (int)((ulong)lVar22 >> 0x20);
        iVar28 = 0;
        auVar29 = auVar29 ^ _DAT_004dcdd0;
        do {
          uVar3 = puVar25[-1];
          uVar23 = 0;
          auVar37 = auVar20;
          auVar38 = auVar19;
          auVar39 = auVar18;
          auVar40 = _DAT_004dfbb0;
          do {
            auVar41 = auVar37 ^ auVar17;
            iVar48 = auVar29._0_4_;
            iVar47 = -(uint)(iVar48 < auVar41._0_4_);
            iVar36 = auVar29._4_4_;
            auVar42._4_4_ = -(uint)(iVar36 < auVar41._4_4_);
            iVar52 = auVar29._8_4_;
            iVar51 = -(uint)(iVar52 < auVar41._8_4_);
            iVar30 = auVar29._12_4_;
            auVar42._12_4_ = -(uint)(iVar30 < auVar41._12_4_);
            auVar31._4_4_ = iVar47;
            auVar31._0_4_ = iVar47;
            auVar31._8_4_ = iVar51;
            auVar31._12_4_ = iVar51;
            auVar53 = pshuflw(in_XMM15,auVar31,0xe8);
            auVar32._4_4_ = -(uint)(auVar41._4_4_ == iVar36);
            auVar32._12_4_ = -(uint)(auVar41._12_4_ == iVar30);
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            auVar31 = pshuflw(in_XMM1,auVar32,0xe8);
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar54 = pshuflw(auVar53,auVar42,0xe8);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar41 = (auVar54 | auVar31 & auVar53) ^ auVar41;
            auVar41 = packssdw(auVar41,auVar41);
            if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar25[uVar23] = uVar3;
            }
            auVar54._4_4_ = iVar47;
            auVar54._0_4_ = iVar47;
            auVar54._8_4_ = iVar51;
            auVar54._12_4_ = iVar51;
            auVar42 = auVar32 & auVar54 | auVar42;
            auVar31 = packssdw(auVar42,auVar42);
            auVar53._8_4_ = 0xffffffff;
            auVar53._0_8_ = 0xffffffffffffffff;
            auVar53._12_4_ = 0xffffffff;
            auVar31 = packssdw(auVar31 ^ auVar53,auVar31 ^ auVar53);
            if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
              puVar25[uVar23 + 1] = uVar3;
            }
            auVar31 = auVar38 ^ auVar17;
            iVar47 = -(uint)(iVar48 < auVar31._0_4_);
            auVar49._4_4_ = -(uint)(iVar36 < auVar31._4_4_);
            iVar51 = -(uint)(iVar52 < auVar31._8_4_);
            auVar49._12_4_ = -(uint)(iVar30 < auVar31._12_4_);
            auVar43._4_4_ = iVar47;
            auVar43._0_4_ = iVar47;
            auVar43._8_4_ = iVar51;
            auVar43._12_4_ = iVar51;
            iVar47 = -(uint)(auVar31._4_4_ == iVar36);
            iVar51 = -(uint)(auVar31._12_4_ == iVar30);
            auVar11._4_4_ = iVar47;
            auVar11._0_4_ = iVar47;
            auVar11._8_4_ = iVar51;
            auVar11._12_4_ = iVar51;
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar31 = auVar11 & auVar43 | auVar49;
            auVar31 = packssdw(auVar31,auVar31);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar31 = packssdw(auVar31 ^ auVar7,auVar31 ^ auVar7);
            if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar25[uVar23 + 2] = uVar3;
            }
            auVar31 = pshufhw(auVar31,auVar43,0x84);
            auVar12._4_4_ = iVar47;
            auVar12._0_4_ = iVar47;
            auVar12._8_4_ = iVar51;
            auVar12._12_4_ = iVar51;
            auVar42 = pshufhw(auVar43,auVar12,0x84);
            auVar32 = pshufhw(auVar31,auVar49,0x84);
            auVar33._8_4_ = 0xffffffff;
            auVar33._0_8_ = 0xffffffffffffffff;
            auVar33._12_4_ = 0xffffffff;
            auVar33 = (auVar32 | auVar42 & auVar31) ^ auVar33;
            auVar31 = packssdw(auVar33,auVar33);
            if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar25[uVar23 + 3] = uVar3;
            }
            auVar31 = auVar39 ^ auVar17;
            iVar47 = -(uint)(iVar48 < auVar31._0_4_);
            auVar45._4_4_ = -(uint)(iVar36 < auVar31._4_4_);
            iVar51 = -(uint)(iVar52 < auVar31._8_4_);
            auVar45._12_4_ = -(uint)(iVar30 < auVar31._12_4_);
            auVar13._4_4_ = iVar47;
            auVar13._0_4_ = iVar47;
            auVar13._8_4_ = iVar51;
            auVar13._12_4_ = iVar51;
            auVar32 = pshuflw(auVar41,auVar13,0xe8);
            auVar34._0_4_ = -(uint)(auVar31._0_4_ == iVar48);
            auVar34._4_4_ = -(uint)(auVar31._4_4_ == iVar36);
            auVar34._8_4_ = -(uint)(auVar31._8_4_ == iVar52);
            auVar34._12_4_ = -(uint)(auVar31._12_4_ == iVar30);
            auVar44._4_4_ = auVar34._4_4_;
            auVar44._0_4_ = auVar34._4_4_;
            auVar44._8_4_ = auVar34._12_4_;
            auVar44._12_4_ = auVar34._12_4_;
            auVar41 = pshuflw(auVar34,auVar44,0xe8);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar31 = pshuflw(auVar32,auVar45,0xe8);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            in_XMM15 = (auVar31 | auVar41 & auVar32) ^ auVar8;
            auVar41 = packssdw(auVar41 & auVar32,in_XMM15);
            if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar25[uVar23 + 4] = uVar3;
            }
            auVar14._4_4_ = iVar47;
            auVar14._0_4_ = iVar47;
            auVar14._8_4_ = iVar51;
            auVar14._12_4_ = iVar51;
            auVar45 = auVar44 & auVar14 | auVar45;
            auVar31 = packssdw(auVar45,auVar45);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar41 = packssdw(auVar41,auVar31 ^ auVar9);
            if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar25[uVar23 + 5] = uVar3;
            }
            auVar41 = auVar40 ^ auVar17;
            iVar48 = -(uint)(iVar48 < auVar41._0_4_);
            auVar50._4_4_ = -(uint)(iVar36 < auVar41._4_4_);
            iVar52 = -(uint)(iVar52 < auVar41._8_4_);
            auVar50._12_4_ = -(uint)(iVar30 < auVar41._12_4_);
            auVar46._4_4_ = iVar48;
            auVar46._0_4_ = iVar48;
            auVar46._8_4_ = iVar52;
            auVar46._12_4_ = iVar52;
            iVar48 = -(uint)(auVar41._4_4_ == iVar36);
            iVar36 = -(uint)(auVar41._12_4_ == iVar30);
            auVar15._4_4_ = iVar48;
            auVar15._0_4_ = iVar48;
            auVar15._8_4_ = iVar36;
            auVar15._12_4_ = iVar36;
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar41 = auVar15 & auVar46 | auVar50;
            auVar41 = packssdw(auVar41,auVar41);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar41 = packssdw(auVar41 ^ auVar10,auVar41 ^ auVar10);
            if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar25[uVar23 + 6] = uVar3;
            }
            auVar41 = pshufhw(auVar41,auVar46,0x84);
            auVar16._4_4_ = iVar48;
            auVar16._0_4_ = iVar48;
            auVar16._8_4_ = iVar36;
            auVar16._12_4_ = iVar36;
            auVar32 = pshufhw(auVar46,auVar16,0x84);
            auVar31 = pshufhw(auVar41,auVar50,0x84);
            auVar35._8_4_ = 0xffffffff;
            auVar35._0_8_ = 0xffffffffffffffff;
            auVar35._12_4_ = 0xffffffff;
            auVar35 = (auVar31 | auVar32 & auVar41) ^ auVar35;
            in_XMM1 = packssdw(auVar35,auVar35);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar25[uVar23 + 7] = uVar3;
            }
            uVar23 = uVar23 + 8;
            lVar22 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 8;
            auVar37._8_8_ = lVar22 + 8;
            lVar22 = auVar38._8_8_;
            auVar38._0_8_ = auVar38._0_8_ + 8;
            auVar38._8_8_ = lVar22 + 8;
            lVar22 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 8;
            auVar39._8_8_ = lVar22 + 8;
            lVar22 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + 8;
            auVar40._8_8_ = lVar22 + 8;
          } while ((uVar27 + 7 & 0xfffffff8) != uVar23);
          puVar25 = puVar25 + 0x20;
          iVar28 = iVar28 + 1;
        } while (iVar28 != iVar5);
      }
      (xd->cfl).buf_width = uVar4;
    }
    if (0 < iVar26) {
      puVar25 = pCVar1->recon_buf_q3 + (long)iVar5 * 0x20;
      iVar28 = 0;
      do {
        uVar23 = 0;
        do {
          puVar25[uVar23] = puVar25[uVar23 - 0x20];
          uVar23 = uVar23 + 1;
        } while (uVar4 != uVar23);
        puVar25 = puVar25 + 0x20;
        iVar28 = iVar28 + 1;
      } while (iVar28 != iVar26);
      (xd->cfl).buf_height = iVar24;
    }
    p_Var21 = (*cfl_get_subtract_average_fn)(tx_size);
    (*p_Var21)(pCVar1->recon_buf_q3,(xd->cfl).ac_buf_q3);
    (xd->cfl).are_parameters_computed = 1;
  }
  iVar24 = (int)pMVar6->cfl_alpha_signs;
  if ((plane & 0xffU) == 1) {
    iVar24 = iVar24 * 0xb + 0xb >> 5;
  }
  else {
    iVar24 = iVar24 + 1 + (iVar24 + (iVar24 + 1) * 10 + 1 >> 5) * -3;
  }
  if (iVar24 == 0) {
    uVar4 = 0;
  }
  else {
    bVar2 = pMVar6->cfl_alpha_idx;
    uVar27 = bVar2 & 0xf;
    if ((plane & 0xffU) == 1) {
      uVar27 = (uint)(bVar2 >> 4);
    }
    uVar4 = ~uVar27;
    if (iVar24 == 2) {
      uVar4 = uVar27 + 1;
    }
  }
  if ((xd->cur_buf->flags & 8) != 0) {
    UNRECOVERED_JUMPTABLE = (*cfl_get_predict_hbd_fn)(tx_size);
    (*UNRECOVERED_JUMPTABLE)
              ((xd->cfl).ac_buf_q3,(uint16_t *)((long)dst * 2),dst_stride,uVar4,xd->bd);
    return;
  }
  UNRECOVERED_JUMPTABLE_00 = (*cfl_get_predict_lbd_fn)(tx_size);
  (*UNRECOVERED_JUMPTABLE_00)((xd->cfl).ac_buf_q3,dst,dst_stride,uVar4);
  return;
}

Assistant:

void av1_cfl_predict_block(MACROBLOCKD *const xd, uint8_t *dst, int dst_stride,
                           TX_SIZE tx_size, int plane) {
  CFL_CTX *const cfl = &xd->cfl;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(is_cfl_allowed(xd));

  if (!cfl->are_parameters_computed) cfl_compute_parameters(xd, tx_size);

  const int alpha_q3 =
      cfl_idx_to_alpha(mbmi->cfl_alpha_idx, mbmi->cfl_alpha_signs, plane - 1);
  assert((tx_size_high[tx_size] - 1) * CFL_BUF_LINE + tx_size_wide[tx_size] <=
         CFL_BUF_SQUARE);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    uint16_t *dst_16 = CONVERT_TO_SHORTPTR(dst);
    cfl_get_predict_hbd_fn(tx_size)(cfl->ac_buf_q3, dst_16, dst_stride,
                                    alpha_q3, xd->bd);
    return;
  }
#endif
  cfl_get_predict_lbd_fn(tx_size)(cfl->ac_buf_q3, dst, dst_stride, alpha_q3);
}